

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int BIO_read_asn1(BIO *bio,uint8_t **out,size_t *out_len,size_t max_len)

{
  int iVar1;
  ulong len_00;
  size_t size;
  uint8_t *puVar2;
  uint local_60;
  uint local_5c;
  uint i;
  uint32_t len32;
  size_t num_bytes;
  size_t header_len;
  size_t len;
  uint8_t length_byte;
  uint8_t tag;
  int eof_on_first_read;
  size_t sStack_30;
  uint8_t header [6];
  size_t max_len_local;
  size_t *out_len_local;
  uint8_t **out_local;
  BIO *bio_local;
  
  sStack_30 = max_len;
  iVar1 = bio_read_full(bio,&length_byte,(int *)((long)&len + 4),2);
  if (iVar1 == 0) {
    if (len._4_4_ == 0) {
      ERR_put_error(0xc,0,0xa2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                    ,0x1df);
    }
    else {
      ERR_put_error(0xc,0,0x7b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                    ,0x1dd);
    }
    bio_local._4_4_ = 0;
  }
  else {
    len._3_1_ = length_byte;
    len._2_1_ = tag;
    if ((length_byte & 0x1f) == 0x1f) {
      ERR_put_error(0xc,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                    ,0x1e9);
      bio_local._4_4_ = 0;
    }
    else {
      if ((tag & 0x80) == 0) {
        header_len = (size_t)tag;
        num_bytes = 2;
      }
      else {
        len_00 = (ulong)(int)(tag & 0x7f);
        if (((length_byte & 0x20) != 0) && (len_00 == 0)) {
          iVar1 = bio_read_all(bio,out,out_len,&length_byte,2,sStack_30);
          if (iVar1 == 0) {
            ERR_put_error(0xc,0,0xa2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                          ,0x1f9);
            return 0;
          }
          return 1;
        }
        if ((len_00 == 0) || (4 < len_00)) {
          ERR_put_error(0xc,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                        ,0x200);
          return 0;
        }
        iVar1 = bio_read_full(bio,(uint8_t *)&eof_on_first_read,(int *)0x0,len_00);
        if (iVar1 == 0) {
          ERR_put_error(0xc,0,0xa2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                        ,0x205);
          return 0;
        }
        num_bytes = len_00 + 2;
        local_5c = 0;
        for (local_60 = 0; local_60 < len_00; local_60 = local_60 + 1) {
          local_5c = (uint)*(byte *)((long)&eof_on_first_read + (ulong)local_60) | local_5c << 8;
        }
        if (local_5c < 0x80) {
          ERR_put_error(0xc,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                        ,0x212);
          return 0;
        }
        if (local_5c >> (((char)(tag & 0x7f) + -1) * '\b' & 0x1fU) == 0) {
          ERR_put_error(0xc,0,0x6d,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                        ,0x218);
          return 0;
        }
        header_len = (size_t)local_5c;
      }
      if (((header_len + num_bytes < header_len) || (sStack_30 < header_len + num_bytes)) ||
         (0x7fffffff < header_len)) {
        ERR_put_error(0xc,0,0xb1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                      ,0x220);
        bio_local._4_4_ = 0;
      }
      else {
        size = num_bytes + header_len;
        *out_len = size;
        puVar2 = (uint8_t *)OPENSSL_malloc(size);
        *out = puVar2;
        if (*out == (uint8_t *)0x0) {
          bio_local._4_4_ = 0;
        }
        else {
          OPENSSL_memcpy(*out,&length_byte,num_bytes);
          iVar1 = bio_read_full(bio,*out + num_bytes,(int *)0x0,size - num_bytes);
          if (iVar1 == 0) {
            ERR_put_error(0xc,0,0xa2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                          ,0x22c);
            OPENSSL_free(*out);
            bio_local._4_4_ = 0;
          }
          else {
            bio_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return bio_local._4_4_;
}

Assistant:

int BIO_read_asn1(BIO *bio, uint8_t **out, size_t *out_len, size_t max_len) {
  uint8_t header[6];

  static const size_t kInitialHeaderLen = 2;
  int eof_on_first_read;
  if (!bio_read_full(bio, header, &eof_on_first_read, kInitialHeaderLen)) {
    if (eof_on_first_read) {
      // Historically, OpenSSL returned |ASN1_R_HEADER_TOO_LONG| when
      // |d2i_*_bio| could not read anything. CPython conditions on this to
      // determine if |bio| was empty.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_HEADER_TOO_LONG);
    } else {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    }
    return 0;
  }

  const uint8_t tag = header[0];
  const uint8_t length_byte = header[1];

  if ((tag & 0x1f) == 0x1f) {
    // Long form tags are not supported.
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
    return 0;
  }

  size_t len, header_len;
  if ((length_byte & 0x80) == 0) {
    // Short form length.
    len = length_byte;
    header_len = kInitialHeaderLen;
  } else {
    const size_t num_bytes = length_byte & 0x7f;

    if ((tag & 0x20 /* constructed */) != 0 && num_bytes == 0) {
      // indefinite length.
      if (!bio_read_all(bio, out, out_len, header, kInitialHeaderLen,
                        max_len)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
        return 0;
      }
      return 1;
    }

    if (num_bytes == 0 || num_bytes > 4) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if (!bio_read_full(bio, header + kInitialHeaderLen, NULL, num_bytes)) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
      return 0;
    }
    header_len = kInitialHeaderLen + num_bytes;

    uint32_t len32 = 0;
    for (unsigned i = 0; i < num_bytes; i++) {
      len32 <<= 8;
      len32 |= header[kInitialHeaderLen + i];
    }

    if (len32 < 128) {
      // Length should have used short-form encoding.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    if ((len32 >> ((num_bytes - 1) * 8)) == 0) {
      // Length should have been at least one byte shorter.
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_DECODE_ERROR);
      return 0;
    }

    len = len32;
  }

  if (len + header_len < len || len + header_len > max_len || len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
    return 0;
  }
  len += header_len;
  *out_len = len;

  *out = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
  if (*out == NULL) {
    return 0;
  }
  OPENSSL_memcpy(*out, header, header_len);
  if (!bio_read_full(bio, (*out) + header_len, NULL, len - header_len)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ENOUGH_DATA);
    OPENSSL_free(*out);
    return 0;
  }

  return 1;
}